

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O0

Mesh * vera::cubeMesh(Mesh *__return_storage_ptr__,float _size)

{
  uint32_t local_108 [2];
  uint32_t indices [36];
  float vertices [24];
  float _size_local;
  Mesh *mesh;
  
  indices[0x22] = (uint32_t)-_size;
  indices[0x23] = (uint32_t)_size;
  memcpy(local_108,&DAT_005e2a50,0x90);
  Mesh::Mesh(__return_storage_ptr__);
  Mesh::addVertices(__return_storage_ptr__,(vec3 *)(indices + 0x22),8);
  Mesh::addIndices(__return_storage_ptr__,local_108,0x24);
  return __return_storage_ptr__;
}

Assistant:

Mesh cubeMesh(float _size) {
    float vertices[] = {
        -_size,  _size,  _size,
        -_size, -_size,  _size,
         _size, -_size,  _size,
         _size,  _size,  _size,
        -_size,  _size, -_size,
        -_size, -_size, -_size,
         _size, -_size, -_size,
         _size,  _size, -_size,
    };

    INDEX_TYPE indices[] = {
        0, 1, 2,
        0, 2, 3,
        3, 2, 6,
        3, 6, 7,
        0, 4, 7,
        0, 7, 3,
        4, 6, 7,
        4, 6, 5,
        0, 5, 4,
        0, 5, 1,
        1, 6, 5,
        1, 6, 2,
    };

    Mesh mesh;
    mesh.addVertices(reinterpret_cast<glm::vec3*>(vertices), 8);
    mesh.addIndices(indices, 36);
    return mesh;
}